

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O3

PAL_ERROR CorUnix::CPalSynchronizationManager::Initialize(void)

{
  CPalSynchronizationManager *this;
  bool bVar1;
  
  LOCK();
  bVar1 = s_lInitStatus == 0;
  if (bVar1) {
    s_lInitStatus = 1;
  }
  UNLOCK();
  if (!bVar1) {
    fprintf(_stderr,"] %s %s:%d","Initialize",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0x5d9);
    fprintf(_stderr,"Synchronization Manager already being initialized");
    s_lInitStatus = 5;
    s_pObjSynchMgr = (CPalSynchronizationManager *)0x0;
    g_pSynchronizationManager = (CPalSynchronizationManager *)0x0;
    return 0x54f;
  }
  InternalInitializeCriticalSection((CRITICAL_SECTION *)s_csSynchProcessLock);
  InternalInitializeCriticalSection((CRITICAL_SECTION *)s_csMonitoredProcessesLock);
  this = (CPalSynchronizationManager *)InternalMalloc(0x580);
  if (this == (CPalSynchronizationManager *)0x0) {
    if (PAL_InitializeChakraCoreCalled != false) {
      g_pSynchronizationManager = (CPalSynchronizationManager *)0x0;
      s_pObjSynchMgr = (CPalSynchronizationManager *)0x0;
      s_lInitStatus = 5;
      return 8;
    }
  }
  else {
    CPalSynchronizationManager(this);
    bVar1 = CreateProcessPipe(this);
    if (bVar1) {
      g_pSynchronizationManager = this;
      s_pObjSynchMgr = this;
      s_lInitStatus = 2;
      return 0;
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      s_lInitStatus = 5;
      ShutdownProcessPipe(this);
      s_pObjSynchMgr = (CPalSynchronizationManager *)0x0;
      g_pSynchronizationManager = (CPalSynchronizationManager *)0x0;
      (*(this->super_IPalSynchronizationManager)._vptr_IPalSynchronizationManager[0xe])(this);
      InternalFree(this);
      return 0x6e;
    }
  }
  abort();
}

Assistant:

PAL_ERROR CPalSynchronizationManager::Initialize()
    {
        PAL_ERROR palErr = NO_ERROR;
        LONG lInit;
        CPalSynchronizationManager * pSynchManager = NULL;

        lInit = InterlockedCompareExchange(&s_lInitStatus,
                                           (LONG)SynchMgrStatusInitializing,
                                           (LONG)SynchMgrStatusIdle);
        if ((LONG)SynchMgrStatusIdle != lInit)
        {
            ASSERT("Synchronization Manager already being initialized");
            palErr = ERROR_INTERNAL_ERROR;
            goto I_exit;
        }

        InternalInitializeCriticalSection(&s_csSynchProcessLock);
        InternalInitializeCriticalSection(&s_csMonitoredProcessesLock);

        pSynchManager = InternalNew<CPalSynchronizationManager>();
        if (NULL == pSynchManager)
        {
            ERROR("Failed to allocate memory for Synchronization Manager");
            palErr = ERROR_NOT_ENOUGH_MEMORY;
            goto I_exit;
        }

        if (!pSynchManager->CreateProcessPipe())
        {
            ERROR("Unable to create process pipe \n");
            palErr = ERROR_OPEN_FAILED;
            goto I_exit;
        }

        s_pObjSynchMgr = pSynchManager;

        // Initialization was successful
        g_pSynchronizationManager =
            static_cast<IPalSynchronizationManager *>(pSynchManager);
        s_lInitStatus = (LONG)SynchMgrStatusRunning;

    I_exit:
        if (NO_ERROR != palErr)
        {
            s_lInitStatus = (LONG)SynchMgrStatusError;
            if (NULL != pSynchManager)
            {
                pSynchManager->ShutdownProcessPipe();
            }
            s_pObjSynchMgr = NULL;
            g_pSynchronizationManager = NULL;
            InternalDelete(pSynchManager);
        }

        return palErr;
    }